

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

void __thiscall
cfd::TransactionContext::AddSchnorrSign
          (TransactionContext *this,OutPoint *outpoint,SchnorrSignature *signature,ByteData *annex)

{
  initializer_list<cfd::SignParameter> __l;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  allocator_type local_c9;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_c8;
  ByteData local_b0;
  SignParameter local_98;
  
  core::SchnorrSignature::GetData(&local_b0,signature,true);
  SignParameter::SignParameter(&local_98,&local_b0);
  __l._M_len = 1;
  __l._M_array = &local_98;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&local_c8,__l,&local_c9);
  local_98.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00734d50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.op_code_.text_data_._M_dataplus._M_p != &local_98.op_code_.text_data_.field_2) {
    operator_delete(local_98.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_98.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (annex != (ByteData *)0x0) {
    std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
    emplace_back<cfd::core::ByteData_const&>
              ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&local_c8,annex);
  }
  TransactionContextUtil::AddSign<cfd::TransactionContext>(this,outpoint,&local_c8,true,true);
  core::SchnorrSignature::GetSigHashType((SchnorrSignature *)&local_98);
  std::
  _Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>>
  ::_M_emplace_unique<cfd::core::OutPoint_const&,cfd::core::SigHashType>
            ((_Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>>
              *)&this->signed_map_,outpoint,(SigHashType *)&local_98);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_c8);
  return;
}

Assistant:

void TransactionContext::AddSchnorrSign(
    const OutPoint& outpoint, const SchnorrSignature& signature,
    const ByteData* annex) {
  std::vector<SignParameter> sign_params = {
      SignParameter(signature.GetData(true))};
  if (annex != nullptr) sign_params.emplace_back(*annex);
  AddSign(outpoint, sign_params, true, true);
  signed_map_.emplace(outpoint, signature.GetSigHashType());
}